

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O0

int nn_timerset_timeout(nn_timerset *self)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint64_t uVar3;
  int local_34;
  nn_list_item *local_28;
  int timeout;
  nn_timerset *self_local;
  
  iVar1 = nn_list_empty(&self->timeouts);
  if (iVar1 == 0) {
    pnVar2 = nn_list_begin(&self->timeouts);
    if (pnVar2 == (nn_list_item *)0x0) {
      local_28 = (nn_list_item *)0x0;
    }
    else {
      local_28 = nn_list_begin(&self->timeouts);
    }
    pnVar2 = local_28[1].next;
    uVar3 = nn_clock_ms();
    local_34 = (int)pnVar2 - (int)uVar3;
    if (local_34 < 0) {
      local_34 = 0;
    }
    self_local._4_4_ = local_34;
  }
  else {
    self_local._4_4_ = -1;
  }
  return self_local._4_4_;
}

Assistant:

int nn_timerset_timeout (struct nn_timerset *self)
{
    int timeout;

    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -1;

    timeout = (int) (nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list)->timeout - nn_clock_ms());
    return timeout < 0 ? 0 : timeout;
}